

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void cxxopts::values::integer_parser<unsigned_short>(string *text,unsigned_short *value)

{
  byte bVar1;
  _Alloc_hider _Var2;
  short sVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  size_type sVar7;
  IntegerDesc int_desc;
  IntegerDesc local_90;
  
  parser_tool::SplitInteger(&local_90,text);
  _Var2._M_p = local_90.value._M_dataplus._M_p;
  if (local_90.value._M_string_length == 0) {
    uVar5 = 0;
  }
  else {
    sVar4 = 10;
    if (local_90.base._M_string_length != 0) {
      sVar4 = 0x10;
    }
    sVar7 = 0;
    uVar6 = 0;
    do {
      bVar1 = _Var2._M_p[sVar7];
      if ((byte)(bVar1 - 0x30) < 10) {
        sVar3 = bVar1 - 0x30;
      }
      else if ((local_90.base._M_string_length == 0) || (5 < (byte)(bVar1 + 0x9f))) {
        if ((local_90.base._M_string_length == 0) || (5 < (byte)(bVar1 + 0xbf))) {
          throw_or_mimic<cxxopts::argument_incorrect_type>(text);
          sVar3 = 0;
        }
        else {
          sVar3 = bVar1 - 0x37;
        }
      }
      else {
        sVar3 = bVar1 - 0x57;
      }
      uVar5 = sVar3 + uVar6 * sVar4;
      if (uVar5 < uVar6) {
        throw_or_mimic<cxxopts::argument_incorrect_type>(text);
      }
      sVar7 = sVar7 + 1;
      uVar6 = uVar5;
    } while (local_90.value._M_string_length != sVar7);
  }
  if (local_90.negative._M_string_length == 0) {
    *value = uVar5;
  }
  else {
    throw_or_mimic<cxxopts::argument_incorrect_type>(text);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.value._M_dataplus._M_p != &local_90.value.field_2) {
    operator_delete(local_90.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.base._M_dataplus._M_p != &local_90.base.field_2) {
    operator_delete(local_90.base._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.negative._M_dataplus._M_p != &local_90.negative.field_2) {
    operator_delete(local_90.negative._M_dataplus._M_p);
  }
  return;
}

Assistant:

void
    integer_parser(const std::string& text, T& value)
    {
      parser_tool::IntegerDesc int_desc = parser_tool::SplitInteger(text);

      using US = typename std::make_unsigned<T>::type;
      constexpr bool is_signed = std::numeric_limits<T>::is_signed;

      const bool          negative    = int_desc.negative.length() > 0;
      const uint8_t       base        = int_desc.base.length() > 0 ? 16 : 10;
      const std::string & value_match = int_desc.value;

      US result = 0;

      for (char ch : value_match)
      {
        US digit = 0;

        if (ch >= '0' && ch <= '9')
        {
          digit = static_cast<US>(ch - '0');
        }
        else if (base == 16 && ch >= 'a' && ch <= 'f')
        {
          digit = static_cast<US>(ch - 'a' + 10);
        }
        else if (base == 16 && ch >= 'A' && ch <= 'F')
        {
          digit = static_cast<US>(ch - 'A' + 10);
        }
        else
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        const US next = static_cast<US>(result * base + digit);
        if (result > next)
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        result = next;
      }

      detail::check_signed_range<T>(negative, result, text);

      if (negative)
      {
        checked_negate<T>(value, result, text, std::integral_constant<bool, is_signed>());
      }
      else
      {
        value = static_cast<T>(result);
      }
    }